

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_TestShell::
~TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_TestShell
          (TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_TestShell *this)

{
  TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_TestShell *this_local;
  
  ~TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInOneScopeButActualCallInAnotherScope)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "class::foo", emptyExpectations);

    mock("scope").expectOneCall("foo");
    mock("class").actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().clear();
}